

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int matchQuality(FuncDef *p,int nArg,u8 enc)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  
  if (nArg != -2) {
    sVar1 = p->nArg;
    iVar3 = 0;
    if (sVar1 < 0 || sVar1 == nArg) {
      uVar2 = (uint)(sVar1 == nArg) * 3 + 1;
      if (p->iPrefEnc == enc) {
        return uVar2 | 2;
      }
      iVar3 = uVar2 + (((p->iPrefEnc & enc) >> 1 & 1) != 0);
    }
    return iVar3;
  }
  if (p->xFunc != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
    return 6;
  }
  iVar3 = 6;
  if (p->xStep == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int matchQuality(
  FuncDef *p,     /* The function we are evaluating for match quality */
  int nArg,       /* Desired number of arguments.  (-1)==any */
  u8 enc          /* Desired text encoding */
){
  int match;

  /* nArg of -2 is a special case */
  if( nArg==(-2) ) return (p->xFunc==0 && p->xStep==0) ? 0 : FUNC_PERFECT_MATCH;

  /* Wrong number of arguments means "no match" */
  if( p->nArg!=nArg && p->nArg>=0 ) return 0;

  /* Give a better score to a function with a specific number of arguments
  ** than to function that accepts any number of arguments. */
  if( p->nArg==nArg ){
    match = 4;
  }else{
    match = 1;
  }

  /* Bonus points if the text encoding matches */
  if( enc==p->iPrefEnc ){
    match += 2;  /* Exact encoding match */
  }else if( (enc & p->iPrefEnc & 2)!=0 ){
    match += 1;  /* Both are UTF16, but with different byte orders */
  }

  return match;
}